

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedCharacterString3(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  Assimp *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  FIValue FVar6;
  _Alloc_hider _Var7;
  uint8_t *data;
  byte *pbVar8;
  runtime_error *prVar9;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  CFIReaderImpl *in_RSI;
  ulong len;
  shared_ptr<Assimp::FIStringValue> sVar11;
  shared_ptr<const_Assimp::FIValue> sVar12;
  undefined1 local_58 [32];
  FIValue local_38;
  _Alloc_hider _Stack_30;
  
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar1 = *in_RSI->dataP;
  if ((bVar1 & 0x20) != 0) {
    pbVar8 = in_RSI->dataP + 1;
    in_RSI->dataP = pbVar8;
    if (0 < (long)in_RSI->dataEnd - (long)pbVar8) {
      bVar2 = *pbVar8;
      data = (uint8_t *)parseNonEmptyOctetString5Length(in_RSI);
      if ((long)in_RSI->dataEnd - (long)in_RSI->dataP < (long)data) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,(string *)&parseErrorMessage_abi_cxx11_);
        *(undefined ***)prVar9 = &PTR__runtime_error_0081d260;
        __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      len = (ulong)((uint)(bVar2 >> 4) | (bVar1 & 0xf) << 4);
      if ((bVar1 & 0x10) == 0) {
        sVar12 = parseRestrictedAlphabet((CFIReaderImpl *)local_58,(size_t)in_RSI,len);
        _Var10 = sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      }
      else {
        sVar12 = parseEncodedData((CFIReaderImpl *)local_58,(size_t)in_RSI,len);
        _Var10 = sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      }
      uVar5 = local_58._8_8_;
      uVar4 = local_58._0_8_;
      local_58._0_8_ = (pointer)0x0;
      local_58._8_8_ = (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0
      ;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->data)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
           (_func_int **)uVar4;
      (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)uVar5;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        _Var10._M_pi = extraout_RDX_04;
      }
      if ((_Head_base<0UL,_unsigned_char_*,_false>)local_58._8_8_ !=
          (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        _Var10._M_pi = extraout_RDX_05;
      }
      goto LAB_0064fd23;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,(string *)&parseErrorMessage_abi_cxx11_);
LAB_0064fdcb:
    *(undefined ***)prVar9 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  data = (uint8_t *)parseNonEmptyOctetString5Length(in_RSI);
  this_00 = (Assimp *)in_RSI->dataP;
  if ((long)in_RSI->dataEnd - (long)this_00 < (long)data) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,(string *)&parseErrorMessage_abi_cxx11_);
    goto LAB_0064fdcb;
  }
  if ((bVar1 & 0x10) == 0) {
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,this_00,data + (long)this_00)
    ;
    sVar11 = FIStringValue::create((FIStringValue *)&local_38,(string *)local_58);
    _Var7._M_p = _Stack_30._M_p;
    FVar6._vptr_FIValue = local_38._vptr_FIValue;
    _Var10 = sVar11.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_38._vptr_FIValue = (_func_int **)0x0;
    _Stack_30._M_p = (pointer)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         FVar6._vptr_FIValue;
    (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)_Var7._M_p;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      _Var10._M_pi = extraout_RDX;
    }
    if ((pointer)_Stack_30._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_p);
      _Var10._M_pi = extraout_RDX_00;
    }
    if ((undefined1 *)local_58._0_8_ == local_58 + 0x10) goto LAB_0064fd23;
  }
  else {
    if (((ulong)data & 1) != 0) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_0064fdcb;
    }
    parseUTF16String_abi_cxx11_((string *)local_58,this_00,data,in_RCX);
    sVar11 = FIStringValue::create((FIStringValue *)&local_38,(string *)local_58);
    _Var7._M_p = _Stack_30._M_p;
    FVar6._vptr_FIValue = local_38._vptr_FIValue;
    _Var10 = sVar11.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_38._vptr_FIValue = (_func_int **)0x0;
    _Stack_30._M_p = (pointer)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->data)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         FVar6._vptr_FIValue;
    (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)_Var7._M_p;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      _Var10._M_pi = extraout_RDX_01;
    }
    if ((pointer)_Stack_30._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_p);
      _Var10._M_pi = extraout_RDX_02;
    }
    if ((undefined1 *)local_58._0_8_ == local_58 + 0x10) goto LAB_0064fd23;
  }
  operator_delete((void *)local_58._0_8_);
  _Var10._M_pi = extraout_RDX_03;
LAB_0064fd23:
  in_RSI->dataP = in_RSI->dataP + (long)data;
  sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedCharacterString3() { // C.19
        std::shared_ptr<const FIValue> result;
        size_t len;
        uint8_t b = *dataP;
        if (b & 0x20) {
            ++dataP;
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            size_t index = ((b & 0x0f) << 4) | ((*dataP & 0xf0) >> 4); // C.29
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // encoding algorithm (C.19.3.4)
                result = parseEncodedData(index, len);
            }
            else {
                // Restricted alphabet (C.19.3.3)
                result = parseRestrictedAlphabet(index, len);
            }
        }
        else {
            len = parseNonEmptyOctetString5Length();
            if (dataEnd - dataP < static_cast<ptrdiff_t>(len)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            if (b & 0x10) {
                // UTF-16 (C.19.3.2)
                if (len & 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                result = FIStringValue::create(parseUTF16String(dataP, len));
            }
            else {
                // UTF-8 (C.19.3.1)
                result = FIStringValue::create(parseUTF8String(dataP, len));
            }
        }
        dataP += len;
        return result;
    }